

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderConstName(xmlTextReaderPtr reader)

{
  xmlChar *pxVar1;
  xmlNodePtr pxVar2;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    return (xmlChar *)0x0;
  }
  pxVar2 = reader->node;
  if (reader->curnode != (xmlNodePtr)0x0) {
    pxVar2 = reader->curnode;
  }
  pxVar1 = (xmlChar *)0x0;
  switch(pxVar2->type) {
  case XML_ELEMENT_NODE:
  case XML_ATTRIBUTE_NODE:
    if ((pxVar2->ns != (xmlNs *)0x0) && (pxVar1 = pxVar2->ns->prefix, pxVar1 != (xmlChar *)0x0)) {
      pxVar1 = constQString(reader,pxVar1,pxVar2->name);
      return pxVar1;
    }
    pxVar1 = pxVar2->name;
    break;
  case XML_TEXT_NODE:
    pxVar1 = constString(reader,(xmlChar *)"#text");
    return pxVar1;
  case XML_CDATA_SECTION_NODE:
    pxVar1 = constString(reader,(xmlChar *)"#cdata-section");
    return pxVar1;
  case XML_ENTITY_REF_NODE:
  case XML_ENTITY_NODE:
  case XML_PI_NODE:
  case XML_DOCUMENT_TYPE_NODE:
  case XML_NOTATION_NODE:
  case XML_DTD_NODE:
    pxVar1 = constString(reader,pxVar2->name);
    return pxVar1;
  case XML_COMMENT_NODE:
    pxVar1 = constString(reader,(xmlChar *)"#comment");
    return pxVar1;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar1 = constString(reader,(xmlChar *)"#document");
    return pxVar1;
  case XML_DOCUMENT_FRAG_NODE:
    pxVar1 = constString(reader,(xmlChar *)"#document-fragment");
    return pxVar1;
  case XML_NAMESPACE_DECL:
    if (pxVar2->children == (_xmlNode *)0x0) {
      pxVar1 = xmlDictLookup(reader->dict,"xmlns",-1);
      if (pxVar1 == (xmlChar *)0x0) {
        xmlTextReaderErrMemory(reader);
      }
      return pxVar1;
    }
    pxVar1 = constQString(reader,"xmlns",(xmlChar *)pxVar2->children);
    return pxVar1;
  }
  return pxVar1;
}

Assistant:

const xmlChar *
xmlTextReaderConstName(xmlTextReaderPtr reader) {
    xmlNodePtr node;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    if ((node->ns == NULL) ||
		(node->ns->prefix == NULL))
		return(node->name);
	    return(constQString(reader, node->ns->prefix, node->name));
        case XML_TEXT_NODE:
	    return(constString(reader, BAD_CAST "#text"));
        case XML_CDATA_SECTION_NODE:
	    return(constString(reader, BAD_CAST "#cdata-section"));
        case XML_ENTITY_NODE:
        case XML_ENTITY_REF_NODE:
	    return(constString(reader, node->name));
        case XML_PI_NODE:
	    return(constString(reader, node->name));
        case XML_COMMENT_NODE:
	    return(constString(reader, BAD_CAST "#comment"));
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    return(constString(reader, BAD_CAST "#document"));
        case XML_DOCUMENT_FRAG_NODE:
	    return(constString(reader, BAD_CAST "#document-fragment"));
        case XML_NOTATION_NODE:
	    return(constString(reader, node->name));
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DTD_NODE:
	    return(constString(reader, node->name));
        case XML_NAMESPACE_DECL: {
	    xmlNsPtr ns = (xmlNsPtr) node;

	    if (ns->prefix == NULL)
		return(constString(reader, BAD_CAST "xmlns"));
	    return(constQString(reader, BAD_CAST "xmlns", ns->prefix));
	}

        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    return(NULL);
    }
    return(NULL);
}